

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::resetPool
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtDispatcher *param_2)

{
  uint uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  
  if (this->m_numHandles != 0) {
    return;
  }
  this->m_firstFreeHandle = 1;
  uVar1 = this->m_maxHandles;
  if (1 < uVar1) {
    puVar2 = (undefined4 *)&this->m_pHandles[1].super_cbtBroadphaseProxy.field_0x34;
    uVar3 = 1;
    do {
      uVar3 = uVar3 + 1;
      *puVar2 = (int)uVar3;
      uVar1 = this->m_maxHandles;
      puVar2 = puVar2 + 0x16;
    } while (uVar3 < uVar1);
  }
  *(undefined4 *)&this->m_pHandles[uVar1 - 1].super_cbtBroadphaseProxy.field_0x34 = 0;
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::resetPool(cbtDispatcher* /*dispatcher*/)
{
	if (m_numHandles == 0)
	{
		m_firstFreeHandle = 1;
		{
			for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < m_maxHandles; i++)
				m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
			m_pHandles[m_maxHandles - 1].SetNextFree(0);
		}
	}
}